

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

wchar_t square_door_power(chunk *c,loc grid)

{
  _Bool _Var1;
  trap_kind *ptVar2;
  trap *ptVar3;
  
  ptVar2 = (trap_kind *)lookup_trap("door lock");
  _Var1 = square_iscloseddoor((chunk_conflict *)c,grid);
  if ((_Var1) && (_Var1 = square_trap_specific(c,grid,ptVar2->tidx), _Var1)) {
    for (ptVar3 = square_trap((chunk_conflict *)c,grid); ptVar3 != (trap *)0x0;
        ptVar3 = ptVar3->next) {
      if (ptVar3->kind == ptVar2) {
        return (uint)ptVar3->power;
      }
    }
  }
  return L'\0';
}

Assistant:

int square_door_power(struct chunk *c, struct loc grid)
{
	struct trap_kind *lock = lookup_trap("door lock");
	struct trap *trap;

	/* Verify it's a closed door */
	if (!square_iscloseddoor(c, grid))
		return 0;

	/* Is there a lock there? */
	if (!square_trap_specific(c, grid, lock->tidx))
		return 0;

	/* Get the power and return it */
	trap = square_trap(c, grid);
	while (trap) {
		if (trap->kind == lock)
			return trap->power;
		trap = trap->next;
	}

	return 0;
}